

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double chi_square_noncentral_check(double a,double b)

{
  char *pcVar1;
  
  if (1.0 <= a) {
    if (0.0 <= b) {
      return 1.0;
    }
    pcVar1 = "  B < 0.\n";
  }
  else {
    pcVar1 = "  A < 1.\n";
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"CHI_SQUARE_NONCENTRAL_CHECK - Warning!\n");
  std::operator<<((ostream *)&std::cerr,pcVar1);
  return 0.0;
}

Assistant:

double chi_square_noncentral_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_NONCENTRAL_CHECK checks the parameters of the noncentral Chi Squared PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the parameter of the PDF.
//    1.0 <= A.
//
//    Input, double B, the noncentrality parameter of the PDF.
//    0.0 <= B.
//
//    Output, bool CHI_SQUARE_NONCENTRAL_CHECK, is true if the parameters
//    are legal.
//
{
  if ( a < 1.0 )
  {
    cerr << " \n";
    cerr << "CHI_SQUARE_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  A < 1.\n";
    return false;
  }

  if ( b < 0.0 )
  {
    cerr << " \n";
    cerr << "CHI_SQUARE_NONCENTRAL_CHECK - Warning!\n";
    cerr << "  B < 0.\n";
    return false;
  }

  return true;
}